

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopAdjustCost(WhereLoop *p,WhereLoop *pTemplate)

{
  LogEst LVar1;
  int iVar2;
  short local_28;
  short local_20;
  WhereLoop *pTemplate_local;
  WhereLoop *p_local;
  
  pTemplate_local = p;
  if ((pTemplate->wsFlags & 0x200) != 0) {
    for (; pTemplate_local != (WhereLoop *)0x0; pTemplate_local = pTemplate_local->pNextLoop) {
      if ((pTemplate_local->iTab == pTemplate->iTab) && ((pTemplate_local->wsFlags & 0x200) != 0)) {
        iVar2 = whereLoopCheaperProperSubset(pTemplate_local,pTemplate);
        if (iVar2 == 0) {
          iVar2 = whereLoopCheaperProperSubset(pTemplate,pTemplate_local);
          if (iVar2 != 0) {
            if (pTemplate->rRun < pTemplate_local->rRun) {
              LVar1 = pTemplate_local->rRun;
            }
            else {
              LVar1 = pTemplate->rRun;
            }
            pTemplate->rRun = LVar1;
            if ((int)pTemplate->nOut < pTemplate_local->nOut + 1) {
              local_28 = pTemplate_local->nOut + 1;
            }
            else {
              local_28 = pTemplate->nOut;
            }
            pTemplate->nOut = local_28;
          }
        }
        else {
          if (pTemplate_local->rRun < pTemplate->rRun) {
            LVar1 = pTemplate_local->rRun;
          }
          else {
            LVar1 = pTemplate->rRun;
          }
          pTemplate->rRun = LVar1;
          if (pTemplate_local->nOut + -1 < (int)pTemplate->nOut) {
            local_20 = pTemplate_local->nOut + -1;
          }
          else {
            local_20 = pTemplate->nOut;
          }
          pTemplate->nOut = local_20;
        }
      }
    }
  }
  return;
}

Assistant:

static void whereLoopAdjustCost(const WhereLoop *p, WhereLoop *pTemplate){
  if( (pTemplate->wsFlags & WHERE_INDEXED)==0 ) return;
  for(; p; p=p->pNextLoop){
    if( p->iTab!=pTemplate->iTab ) continue;
    if( (p->wsFlags & WHERE_INDEXED)==0 ) continue;
    if( whereLoopCheaperProperSubset(p, pTemplate) ){
      /* Adjust pTemplate cost downward so that it is cheaper than its
      ** subset p. */
      WHERETRACE(0x80,("subset cost adjustment %d,%d to %d,%d\n",
                       pTemplate->rRun, pTemplate->nOut,
                       MIN(p->rRun, pTemplate->rRun),
                       MIN(p->nOut - 1, pTemplate->nOut)));
      pTemplate->rRun = MIN(p->rRun, pTemplate->rRun);
      pTemplate->nOut = MIN(p->nOut - 1, pTemplate->nOut);
    }else if( whereLoopCheaperProperSubset(pTemplate, p) ){
      /* Adjust pTemplate cost upward so that it is costlier than p since
      ** pTemplate is a proper subset of p */
      WHERETRACE(0x80,("subset cost adjustment %d,%d to %d,%d\n",
                       pTemplate->rRun, pTemplate->nOut,
                       MAX(p->rRun, pTemplate->rRun),
                       MAX(p->nOut + 1, pTemplate->nOut)));
      pTemplate->rRun = MAX(p->rRun, pTemplate->rRun);
      pTemplate->nOut = MAX(p->nOut + 1, pTemplate->nOut);
    }
  }
}